

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.cpp
# Opt level: O0

void MD5Transform(DWORD *buf,DWORD *in)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  DWORD d;
  DWORD c;
  DWORD b;
  DWORD a;
  DWORD *in_local;
  DWORD *buf_local;
  
  uVar4 = buf[1];
  uVar3 = buf[2];
  uVar2 = buf[3];
  uVar1 = (uVar2 ^ uVar4 & (uVar3 ^ uVar2)) + *in + -0x28955b88 + *buf;
  uVar1 = (uVar1 * 0x80 | uVar1 >> 0x19) + uVar4;
  uVar2 = (uVar3 ^ uVar1 & (uVar4 ^ uVar3)) + in[1] + -0x173848aa + uVar2;
  uVar2 = (uVar2 * 0x1000 | uVar2 >> 0x14) + uVar1;
  uVar3 = (uVar4 ^ uVar2 & (uVar1 ^ uVar4)) + in[2] + 0x242070db + uVar3;
  uVar3 = (uVar3 * 0x20000 | uVar3 >> 0xf) + uVar2;
  uVar4 = (uVar1 ^ uVar3 & (uVar2 ^ uVar1)) + in[3] + -0x3e423112 + uVar4;
  uVar4 = (uVar4 * 0x400000 | uVar4 >> 10) + uVar3;
  uVar1 = (uVar2 ^ uVar4 & (uVar3 ^ uVar2)) + in[4] + -0xa83f051 + uVar1;
  uVar1 = (uVar1 * 0x80 | uVar1 >> 0x19) + uVar4;
  uVar2 = (uVar3 ^ uVar1 & (uVar4 ^ uVar3)) + in[5] + 0x4787c62a + uVar2;
  uVar2 = (uVar2 * 0x1000 | uVar2 >> 0x14) + uVar1;
  uVar3 = (uVar4 ^ uVar2 & (uVar1 ^ uVar4)) + in[6] + -0x57cfb9ed + uVar3;
  uVar3 = (uVar3 * 0x20000 | uVar3 >> 0xf) + uVar2;
  uVar4 = (uVar1 ^ uVar3 & (uVar2 ^ uVar1)) + in[7] + -0x2b96aff + uVar4;
  uVar4 = (uVar4 * 0x400000 | uVar4 >> 10) + uVar3;
  uVar1 = (uVar2 ^ uVar4 & (uVar3 ^ uVar2)) + in[8] + 0x698098d8 + uVar1;
  uVar1 = (uVar1 * 0x80 | uVar1 >> 0x19) + uVar4;
  uVar2 = (uVar3 ^ uVar1 & (uVar4 ^ uVar3)) + in[9] + -0x74bb0851 + uVar2;
  uVar2 = (uVar2 * 0x1000 | uVar2 >> 0x14) + uVar1;
  uVar3 = (uVar4 ^ uVar2 & (uVar1 ^ uVar4)) + in[10] + -0xa44f + uVar3;
  uVar3 = (uVar3 * 0x20000 | uVar3 >> 0xf) + uVar2;
  uVar4 = (uVar1 ^ uVar3 & (uVar2 ^ uVar1)) + in[0xb] + -0x76a32842 + uVar4;
  uVar4 = (uVar4 * 0x400000 | uVar4 >> 10) + uVar3;
  uVar1 = (uVar2 ^ uVar4 & (uVar3 ^ uVar2)) + in[0xc] + 0x6b901122 + uVar1;
  uVar1 = (uVar1 * 0x80 | uVar1 >> 0x19) + uVar4;
  uVar2 = (uVar3 ^ uVar1 & (uVar4 ^ uVar3)) + in[0xd] + -0x2678e6d + uVar2;
  uVar2 = (uVar2 * 0x1000 | uVar2 >> 0x14) + uVar1;
  uVar3 = (uVar4 ^ uVar2 & (uVar1 ^ uVar4)) + in[0xe] + -0x5986bc72 + uVar3;
  uVar3 = (uVar3 * 0x20000 | uVar3 >> 0xf) + uVar2;
  uVar4 = (uVar1 ^ uVar3 & (uVar2 ^ uVar1)) + in[0xf] + 0x49b40821 + uVar4;
  uVar4 = (uVar4 * 0x400000 | uVar4 >> 10) + uVar3;
  uVar1 = (uVar3 ^ uVar2 & (uVar4 ^ uVar3)) + in[1] + -0x9e1da9e + uVar1;
  uVar1 = (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar4;
  uVar2 = (uVar4 ^ uVar3 & (uVar1 ^ uVar4)) + in[6] + -0x3fbf4cc0 + uVar2;
  uVar2 = (uVar2 * 0x200 | uVar2 >> 0x17) + uVar1;
  uVar3 = (uVar1 ^ uVar4 & (uVar2 ^ uVar1)) + in[0xb] + 0x265e5a51 + uVar3;
  uVar3 = (uVar3 * 0x4000 | uVar3 >> 0x12) + uVar2;
  uVar4 = (uVar2 ^ uVar1 & (uVar3 ^ uVar2)) + *in + -0x16493856 + uVar4;
  uVar4 = (uVar4 * 0x100000 | uVar4 >> 0xc) + uVar3;
  uVar1 = (uVar3 ^ uVar2 & (uVar4 ^ uVar3)) + in[5] + -0x29d0efa3 + uVar1;
  uVar1 = (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar4;
  uVar2 = (uVar4 ^ uVar3 & (uVar1 ^ uVar4)) + in[10] + 0x2441453 + uVar2;
  uVar2 = (uVar2 * 0x200 | uVar2 >> 0x17) + uVar1;
  uVar3 = (uVar1 ^ uVar4 & (uVar2 ^ uVar1)) + in[0xf] + -0x275e197f + uVar3;
  uVar3 = (uVar3 * 0x4000 | uVar3 >> 0x12) + uVar2;
  uVar4 = (uVar2 ^ uVar1 & (uVar3 ^ uVar2)) + in[4] + -0x182c0438 + uVar4;
  uVar4 = (uVar4 * 0x100000 | uVar4 >> 0xc) + uVar3;
  uVar1 = (uVar3 ^ uVar2 & (uVar4 ^ uVar3)) + in[9] + 0x21e1cde6 + uVar1;
  uVar1 = (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar4;
  uVar2 = (uVar4 ^ uVar3 & (uVar1 ^ uVar4)) + in[0xe] + -0x3cc8f82a + uVar2;
  uVar2 = (uVar2 * 0x200 | uVar2 >> 0x17) + uVar1;
  uVar3 = (uVar1 ^ uVar4 & (uVar2 ^ uVar1)) + in[3] + -0xb2af279 + uVar3;
  uVar3 = (uVar3 * 0x4000 | uVar3 >> 0x12) + uVar2;
  uVar4 = (uVar2 ^ uVar1 & (uVar3 ^ uVar2)) + in[8] + 0x455a14ed + uVar4;
  uVar4 = (uVar4 * 0x100000 | uVar4 >> 0xc) + uVar3;
  uVar1 = (uVar3 ^ uVar2 & (uVar4 ^ uVar3)) + in[0xd] + -0x561c16fb + uVar1;
  uVar1 = (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar4;
  uVar2 = (uVar4 ^ uVar3 & (uVar1 ^ uVar4)) + in[2] + -0x3105c08 + uVar2;
  uVar2 = (uVar2 * 0x200 | uVar2 >> 0x17) + uVar1;
  uVar3 = (uVar1 ^ uVar4 & (uVar2 ^ uVar1)) + in[7] + 0x676f02d9 + uVar3;
  uVar3 = (uVar3 * 0x4000 | uVar3 >> 0x12) + uVar2;
  uVar4 = (uVar2 ^ uVar1 & (uVar3 ^ uVar2)) + in[0xc] + -0x72d5b376 + uVar4;
  uVar4 = (uVar4 * 0x100000 | uVar4 >> 0xc) + uVar3;
  uVar1 = (uVar4 ^ uVar3 ^ uVar2) + in[5] + -0x5c6be + uVar1;
  uVar1 = (uVar1 * 0x10 | uVar1 >> 0x1c) + uVar4;
  uVar2 = (uVar1 ^ uVar4 ^ uVar3) + in[8] + -0x788e097f + uVar2;
  uVar2 = (uVar2 * 0x800 | uVar2 >> 0x15) + uVar1;
  uVar3 = (uVar2 ^ uVar1 ^ uVar4) + in[0xb] + 0x6d9d6122 + uVar3;
  uVar3 = (uVar3 * 0x10000 | uVar3 >> 0x10) + uVar2;
  uVar4 = (uVar3 ^ uVar2 ^ uVar1) + in[0xe] + -0x21ac7f4 + uVar4;
  uVar4 = (uVar4 * 0x800000 | uVar4 >> 9) + uVar3;
  uVar1 = (uVar4 ^ uVar3 ^ uVar2) + in[1] + -0x5b4115bc + uVar1;
  uVar1 = (uVar1 * 0x10 | uVar1 >> 0x1c) + uVar4;
  uVar2 = (uVar1 ^ uVar4 ^ uVar3) + in[4] + 0x4bdecfa9 + uVar2;
  uVar2 = (uVar2 * 0x800 | uVar2 >> 0x15) + uVar1;
  uVar3 = (uVar2 ^ uVar1 ^ uVar4) + in[7] + -0x944b4a0 + uVar3;
  uVar3 = (uVar3 * 0x10000 | uVar3 >> 0x10) + uVar2;
  uVar4 = (uVar3 ^ uVar2 ^ uVar1) + in[10] + -0x41404390 + uVar4;
  uVar4 = (uVar4 * 0x800000 | uVar4 >> 9) + uVar3;
  uVar1 = (uVar4 ^ uVar3 ^ uVar2) + in[0xd] + 0x289b7ec6 + uVar1;
  uVar1 = (uVar1 * 0x10 | uVar1 >> 0x1c) + uVar4;
  uVar2 = (uVar1 ^ uVar4 ^ uVar3) + *in + -0x155ed806 + uVar2;
  uVar2 = (uVar2 * 0x800 | uVar2 >> 0x15) + uVar1;
  uVar3 = (uVar2 ^ uVar1 ^ uVar4) + in[3] + -0x2b10cf7b + uVar3;
  uVar3 = (uVar3 * 0x10000 | uVar3 >> 0x10) + uVar2;
  uVar4 = (uVar3 ^ uVar2 ^ uVar1) + in[6] + 0x4881d05 + uVar4;
  uVar4 = (uVar4 * 0x800000 | uVar4 >> 9) + uVar3;
  uVar1 = (uVar4 ^ uVar3 ^ uVar2) + in[9] + -0x262b2fc7 + uVar1;
  uVar1 = (uVar1 * 0x10 | uVar1 >> 0x1c) + uVar4;
  uVar2 = (uVar1 ^ uVar4 ^ uVar3) + in[0xc] + -0x1924661b + uVar2;
  uVar2 = (uVar2 * 0x800 | uVar2 >> 0x15) + uVar1;
  uVar3 = (uVar2 ^ uVar1 ^ uVar4) + in[0xf] + 0x1fa27cf8 + uVar3;
  uVar3 = (uVar3 * 0x10000 | uVar3 >> 0x10) + uVar2;
  uVar4 = (uVar3 ^ uVar2 ^ uVar1) + in[2] + -0x3b53a99b + uVar4;
  uVar4 = (uVar4 * 0x800000 | uVar4 >> 9) + uVar3;
  uVar1 = (uVar3 ^ (uVar4 | uVar2 ^ 0xffffffff)) + *in + -0xbd6ddbc + uVar1;
  uVar1 = (uVar1 * 0x40 | uVar1 >> 0x1a) + uVar4;
  uVar2 = (uVar4 ^ (uVar1 | uVar3 ^ 0xffffffff)) + in[7] + 0x432aff97 + uVar2;
  uVar2 = (uVar2 * 0x400 | uVar2 >> 0x16) + uVar1;
  uVar3 = (uVar1 ^ (uVar2 | uVar4 ^ 0xffffffff)) + in[0xe] + -0x546bdc59 + uVar3;
  uVar3 = (uVar3 * 0x8000 | uVar3 >> 0x11) + uVar2;
  uVar4 = (uVar2 ^ (uVar3 | uVar1 ^ 0xffffffff)) + in[5] + -0x36c5fc7 + uVar4;
  uVar4 = (uVar4 * 0x200000 | uVar4 >> 0xb) + uVar3;
  uVar1 = (uVar3 ^ (uVar4 | uVar2 ^ 0xffffffff)) + in[0xc] + 0x655b59c3 + uVar1;
  uVar1 = (uVar1 * 0x40 | uVar1 >> 0x1a) + uVar4;
  uVar2 = (uVar4 ^ (uVar1 | uVar3 ^ 0xffffffff)) + in[3] + -0x70f3336e + uVar2;
  uVar2 = (uVar2 * 0x400 | uVar2 >> 0x16) + uVar1;
  uVar3 = (uVar1 ^ (uVar2 | uVar4 ^ 0xffffffff)) + in[10] + -0x100b83 + uVar3;
  uVar3 = (uVar3 * 0x8000 | uVar3 >> 0x11) + uVar2;
  uVar4 = (uVar2 ^ (uVar3 | uVar1 ^ 0xffffffff)) + in[1] + -0x7a7ba22f + uVar4;
  uVar4 = (uVar4 * 0x200000 | uVar4 >> 0xb) + uVar3;
  uVar1 = (uVar3 ^ (uVar4 | uVar2 ^ 0xffffffff)) + in[8] + 0x6fa87e4f + uVar1;
  uVar1 = (uVar1 * 0x40 | uVar1 >> 0x1a) + uVar4;
  uVar2 = (uVar4 ^ (uVar1 | uVar3 ^ 0xffffffff)) + in[0xf] + -0x1d31920 + uVar2;
  uVar2 = (uVar2 * 0x400 | uVar2 >> 0x16) + uVar1;
  uVar3 = (uVar1 ^ (uVar2 | uVar4 ^ 0xffffffff)) + in[6] + -0x5cfebcec + uVar3;
  uVar5 = (uVar3 * 0x8000 | uVar3 >> 0x11) + uVar2;
  uVar4 = (uVar2 ^ (uVar5 | uVar1 ^ 0xffffffff)) + in[0xd] + 0x4e0811a1 + uVar4;
  uVar6 = (uVar4 * 0x200000 | uVar4 >> 0xb) + uVar5;
  uVar1 = (uVar5 ^ (uVar6 | uVar2 ^ 0xffffffff)) + in[4] + -0x8ac817e + uVar1;
  uVar4 = (uVar1 * 0x40 | uVar1 >> 0x1a) + uVar6;
  uVar2 = (uVar6 ^ (uVar4 | uVar5 ^ 0xffffffff)) + in[0xb] + -0x42c50dcb + uVar2;
  uVar3 = (uVar2 * 0x400 | uVar2 >> 0x16) + uVar4;
  uVar5 = (uVar4 ^ (uVar3 | uVar6 ^ 0xffffffff)) + in[2] + 0x2ad7d2bb + uVar5;
  uVar2 = (uVar5 * 0x8000 | uVar5 >> 0x11) + uVar3;
  uVar6 = (uVar3 ^ (uVar2 | uVar4 ^ 0xffffffff)) + in[9] + -0x14792c6f + uVar6;
  *buf = uVar4 + *buf;
  buf[1] = (uVar6 * 0x200000 | uVar6 >> 0xb) + uVar2 + buf[1];
  buf[2] = uVar2 + buf[2];
  buf[3] = uVar3 + buf[3];
  return;
}

Assistant:

void
MD5Transform(DWORD buf[4], const DWORD in[16])
{
	DWORD a, b, c, d;

	a = buf[0];
	b = buf[1];
	c = buf[2];
	d = buf[3];

	MD5STEP(F1, a, b, c, d, in[0] + 0xd76aa478, 7);
	MD5STEP(F1, d, a, b, c, in[1] + 0xe8c7b756, 12);
	MD5STEP(F1, c, d, a, b, in[2] + 0x242070db, 17);
	MD5STEP(F1, b, c, d, a, in[3] + 0xc1bdceee, 22);
	MD5STEP(F1, a, b, c, d, in[4] + 0xf57c0faf, 7);
	MD5STEP(F1, d, a, b, c, in[5] + 0x4787c62a, 12);
	MD5STEP(F1, c, d, a, b, in[6] + 0xa8304613, 17);
	MD5STEP(F1, b, c, d, a, in[7] + 0xfd469501, 22);
	MD5STEP(F1, a, b, c, d, in[8] + 0x698098d8, 7);
	MD5STEP(F1, d, a, b, c, in[9] + 0x8b44f7af, 12);
	MD5STEP(F1, c, d, a, b, in[10] + 0xffff5bb1, 17);
	MD5STEP(F1, b, c, d, a, in[11] + 0x895cd7be, 22);
	MD5STEP(F1, a, b, c, d, in[12] + 0x6b901122, 7);
	MD5STEP(F1, d, a, b, c, in[13] + 0xfd987193, 12);
	MD5STEP(F1, c, d, a, b, in[14] + 0xa679438e, 17);
	MD5STEP(F1, b, c, d, a, in[15] + 0x49b40821, 22);

	MD5STEP(F2, a, b, c, d, in[1] + 0xf61e2562, 5);
	MD5STEP(F2, d, a, b, c, in[6] + 0xc040b340, 9);
	MD5STEP(F2, c, d, a, b, in[11] + 0x265e5a51, 14);
	MD5STEP(F2, b, c, d, a, in[0] + 0xe9b6c7aa, 20);
	MD5STEP(F2, a, b, c, d, in[5] + 0xd62f105d, 5);
	MD5STEP(F2, d, a, b, c, in[10] + 0x02441453, 9);
	MD5STEP(F2, c, d, a, b, in[15] + 0xd8a1e681, 14);
	MD5STEP(F2, b, c, d, a, in[4] + 0xe7d3fbc8, 20);
	MD5STEP(F2, a, b, c, d, in[9] + 0x21e1cde6, 5);
	MD5STEP(F2, d, a, b, c, in[14] + 0xc33707d6, 9);
	MD5STEP(F2, c, d, a, b, in[3] + 0xf4d50d87, 14);
	MD5STEP(F2, b, c, d, a, in[8] + 0x455a14ed, 20);
	MD5STEP(F2, a, b, c, d, in[13] + 0xa9e3e905, 5);
	MD5STEP(F2, d, a, b, c, in[2] + 0xfcefa3f8, 9);
	MD5STEP(F2, c, d, a, b, in[7] + 0x676f02d9, 14);
	MD5STEP(F2, b, c, d, a, in[12] + 0x8d2a4c8a, 20);

	MD5STEP(F3, a, b, c, d, in[5] + 0xfffa3942, 4);
	MD5STEP(F3, d, a, b, c, in[8] + 0x8771f681, 11);
	MD5STEP(F3, c, d, a, b, in[11] + 0x6d9d6122, 16);
	MD5STEP(F3, b, c, d, a, in[14] + 0xfde5380c, 23);
	MD5STEP(F3, a, b, c, d, in[1] + 0xa4beea44, 4);
	MD5STEP(F3, d, a, b, c, in[4] + 0x4bdecfa9, 11);
	MD5STEP(F3, c, d, a, b, in[7] + 0xf6bb4b60, 16);
	MD5STEP(F3, b, c, d, a, in[10] + 0xbebfbc70, 23);
	MD5STEP(F3, a, b, c, d, in[13] + 0x289b7ec6, 4);
	MD5STEP(F3, d, a, b, c, in[0] + 0xeaa127fa, 11);
	MD5STEP(F3, c, d, a, b, in[3] + 0xd4ef3085, 16);
	MD5STEP(F3, b, c, d, a, in[6] + 0x04881d05, 23);
	MD5STEP(F3, a, b, c, d, in[9] + 0xd9d4d039, 4);
	MD5STEP(F3, d, a, b, c, in[12] + 0xe6db99e5, 11);
	MD5STEP(F3, c, d, a, b, in[15] + 0x1fa27cf8, 16);
	MD5STEP(F3, b, c, d, a, in[2] + 0xc4ac5665, 23);

	MD5STEP(F4, a, b, c, d, in[0] + 0xf4292244, 6);
	MD5STEP(F4, d, a, b, c, in[7] + 0x432aff97, 10);
	MD5STEP(F4, c, d, a, b, in[14] + 0xab9423a7, 15);
	MD5STEP(F4, b, c, d, a, in[5] + 0xfc93a039, 21);
	MD5STEP(F4, a, b, c, d, in[12] + 0x655b59c3, 6);
	MD5STEP(F4, d, a, b, c, in[3] + 0x8f0ccc92, 10);
	MD5STEP(F4, c, d, a, b, in[10] + 0xffeff47d, 15);
	MD5STEP(F4, b, c, d, a, in[1] + 0x85845dd1, 21);
	MD5STEP(F4, a, b, c, d, in[8] + 0x6fa87e4f, 6);
	MD5STEP(F4, d, a, b, c, in[15] + 0xfe2ce6e0, 10);
	MD5STEP(F4, c, d, a, b, in[6] + 0xa3014314, 15);
	MD5STEP(F4, b, c, d, a, in[13] + 0x4e0811a1, 21);
	MD5STEP(F4, a, b, c, d, in[4] + 0xf7537e82, 6);
	MD5STEP(F4, d, a, b, c, in[11] + 0xbd3af235, 10);
	MD5STEP(F4, c, d, a, b, in[2] + 0x2ad7d2bb, 15);
	MD5STEP(F4, b, c, d, a, in[9] + 0xeb86d391, 21);

	buf[0] += a;
	buf[1] += b;
	buf[2] += c;
	buf[3] += d;
}